

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void detachFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  int iVar1;
  sqlite3 *db;
  Btree *p;
  int iVar2;
  char *pcVar3;
  Db *pDVar4;
  char *zRight;
  ulong uVar5;
  long in_FS_OFFSET;
  char zErr [128];
  char local_b8 [128];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar3 = (char *)sqlite3ValueText(*argv,'\x01');
  db = context->pOut->db;
  zRight = "";
  if (pcVar3 != (char *)0x0) {
    zRight = pcVar3;
  }
  iVar1 = db->nDb;
  if (0 < (long)iVar1) {
    pDVar4 = db->aDb;
    uVar5 = 0;
    do {
      p = pDVar4->pBt;
      if (p != (Btree *)0x0) {
        iVar2 = sqlite3StrICmp(pDVar4->zDbSName,zRight);
        if (iVar2 == 0) {
          if (uVar5 < 2) {
            pcVar3 = "cannot detach database %s";
            goto LAB_002525c4;
          }
          if (db->autoCommit == '\0') {
            sqlite3_snprintf(0x80,local_b8,"cannot DETACH database within transaction");
            goto LAB_002525d8;
          }
          if ((p->inTrans != '\0') || (p->nBackup != 0)) {
            pcVar3 = "database %s is locked";
            goto LAB_002525c4;
          }
          sqlite3BtreeClose(p);
          pDVar4->pBt = (Btree *)0x0;
          pDVar4->pSchema = (Schema *)0x0;
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            sqlite3CollapseDatabaseArray(db);
            return;
          }
          goto LAB_002526bd;
        }
      }
      uVar5 = uVar5 + 1;
      pDVar4 = pDVar4 + 1;
    } while ((long)iVar1 != uVar5);
  }
  pcVar3 = "no such database: %s";
LAB_002525c4:
  sqlite3_snprintf(0x80,local_b8,pcVar3,zRight);
LAB_002525d8:
  context->isError = 1;
  context->fErrorOrAux = '\x01';
  sqlite3VdbeMemSetStr(context->pOut,local_b8,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_002526bd:
  __stack_chk_fail();
}

Assistant:

static void detachFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  const char *zName = (const char *)sqlite3_value_text(argv[0]);
  sqlite3 *db = sqlite3_context_db_handle(context);
  int i;
  Db *pDb = 0;
  char zErr[128];

  UNUSED_PARAMETER(NotUsed);

  if( zName==0 ) zName = "";
  for(i=0; i<db->nDb; i++){
    pDb = &db->aDb[i];
    if( pDb->pBt==0 ) continue;
    if( sqlite3StrICmp(pDb->zDbSName, zName)==0 ) break;
  }

  if( i>=db->nDb ){
    sqlite3_snprintf(sizeof(zErr),zErr, "no such database: %s", zName);
    goto detach_error;
  }
  if( i<2 ){
    sqlite3_snprintf(sizeof(zErr),zErr, "cannot detach database %s", zName);
    goto detach_error;
  }
  if( !db->autoCommit ){
    sqlite3_snprintf(sizeof(zErr), zErr,
                     "cannot DETACH database within transaction");
    goto detach_error;
  }
  if( sqlite3BtreeIsInReadTrans(pDb->pBt) || sqlite3BtreeIsInBackup(pDb->pBt) ){
    sqlite3_snprintf(sizeof(zErr),zErr, "database %s is locked", zName);
    goto detach_error;
  }

  sqlite3BtreeClose(pDb->pBt);
  pDb->pBt = 0;
  pDb->pSchema = 0;
  sqlite3CollapseDatabaseArray(db);
  return;

detach_error:
  sqlite3_result_error(context, zErr, -1);
}